

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# symmetric_matrix.cc
# Opt level: O2

double * __thiscall sptk::SymmetricMatrix::At(SymmetricMatrix *this,int row,int column)

{
  int iVar1;
  out_of_range *this_00;
  ulong uVar2;
  
  iVar1 = column;
  if (column < row) {
    iVar1 = row;
  }
  uVar2 = (ulong)(uint)column;
  if (row < column) {
    uVar2 = (ulong)(uint)row;
  }
  if ((-1 < (int)uVar2) && (iVar1 < this->num_dimension_)) {
    return (this->index_).super__Vector_base<double_*,_std::allocator<double_*>_>._M_impl.
           super__Vector_impl_data._M_start[iVar1] + uVar2;
  }
  this_00 = (out_of_range *)__cxa_allocate_exception(0x10);
  std::out_of_range::out_of_range(this_00,"SymmetricMatrix: Out of range");
  __cxa_throw(this_00,&std::out_of_range::typeinfo,std::out_of_range::~out_of_range);
}

Assistant:

const double& SymmetricMatrix::At(int row, int column) const {
  if (row < column) {
    std::swap(row, column);
  }
  if (column < 0 || num_dimension_ <= row) {
    throw std::out_of_range(kErrorMessageForOutOfRange);
  }
  return index_[row][column];
}